

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O0

bool mxx::impl::
     is_sorted<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,MxxDistribution_StableBlockDistr_Test::TestBody()::__0>
               (pair<int,_int> *begin,pair<int,_int> *end,comm *param_3)

{
  bool bVar1;
  int iVar2;
  reference ppVar3;
  byte local_a9;
  comm local_80;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_60;
  pair<int,_int> local_54;
  value_type left_el;
  bool local_31;
  bool sorted;
  comm *comm_local;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_20;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  end_local;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  begin_local;
  
  unique0x10000117 = end;
  local_20._M_current = end;
  end_local._M_current = begin;
  local_31 = std::
             is_sorted<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,MxxDistribution_StableBlockDistr_Test::TestBody()::__0>
                       (begin,end);
  iVar2 = mxx::comm::size(param_3);
  begin_local._M_current._7_1_ = local_31;
  if (iVar2 != 1) {
    local_60 = __gnu_cxx::
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator-(&local_20,1);
    ppVar3 = __gnu_cxx::
             __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
             ::operator*(&local_60);
    mxx::comm::comm(&local_80);
    local_54 = right_shift<std::pair<int,int>>(ppVar3,&local_80);
    mxx::comm::~comm(&local_80);
    iVar2 = mxx::comm::rank(param_3);
    if (0 < iVar2) {
      local_a9 = 0;
      if (local_31) {
        ppVar3 = __gnu_cxx::
                 __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 ::operator*(&end_local);
        bVar1 = __gnu_cxx::__ops::
                _Iter_comp_iter<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_distribution.cpp:56:16)>
                ::anon_class_1_0_00000001_for__M_comp::operator()
                          ((anon_class_1_0_00000001_for__M_comp *)((long)&comm_local + 7),ppVar3,
                           &local_54);
        local_a9 = bVar1 ^ 0xff;
      }
      local_31 = (bool)(local_a9 & 1);
    }
    begin_local._M_current._7_1_ = all_of(local_31,param_3);
  }
  return begin_local._M_current._7_1_;
}

Assistant:

bool is_sorted(_Iterator begin, _Iterator end, _Compare comp, const mxx::comm& comm)
{
    // get value type of underlying data
    typedef typename std::iterator_traits<_Iterator>::value_type value_type;

    // check that it is locally sorted (int for MPI_Reduction)
    bool sorted = std::is_sorted(begin, end, comp);

    // if single process, this is it
    if (comm.size() == 1)
        return sorted;

    // compare if last element on left processor is not bigger than first
    // element on mine
    value_type left_el = mxx::right_shift(*(end-1));

    // check if sorted with respect to neighbors
    if (comm.rank() > 0) {
        sorted = sorted && !comp(*begin, left_el);
    }

    // now check that this condition is true for all processes
    return mxx::all_of(sorted, comm);
}